

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_markdown_generator.cc
# Opt level: O0

void __thiscall t_markdown_generator::print_doc(t_markdown_generator *this,t_doc *tdoc)

{
  bool bVar1;
  string *psVar2;
  string local_38;
  t_doc *local_18;
  t_doc *tdoc_local;
  t_markdown_generator *this_local;
  
  local_18 = tdoc;
  tdoc_local = (t_doc *)this;
  bVar1 = t_doc::has_doc(tdoc);
  if (bVar1) {
    if ((this->unsafe_ & 1U) == 0) {
      psVar2 = t_doc::get_doc_abi_cxx11_(local_18);
      escape_html(&local_38,this,psVar2);
      std::operator<<((ostream *)&this->f_out_,(string *)&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
    else {
      psVar2 = t_doc::get_doc_abi_cxx11_(local_18);
      std::operator<<((ostream *)&this->f_out_,(string *)psVar2);
    }
  }
  return;
}

Assistant:

void t_markdown_generator::print_doc(t_doc* tdoc) {
  if (tdoc->has_doc()) {
    if (unsafe_) {
      f_out_ << tdoc->get_doc();
    } else {
      f_out_ << escape_html(tdoc->get_doc());
    }
  }
}